

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_mirjit.c
# Opt level: O0

int raviV_compile(lua_State *L,Proto *p,ravi_compile_options_t *options)

{
  global_State *pgVar1;
  _func_int_lua_State_ptr *s;
  _Bool _Var2;
  size_t len;
  bool local_79;
  char local_78 [8];
  char fname [30];
  _func_int_lua_State_ptr *fp;
  membuff_t buf;
  _Bool doCompile;
  global_State *G;
  ravi_compile_options_t *options_local;
  Proto *p_local;
  lua_State *L_local;
  
  if ((p->ravi_jit).jit_status == '\x02') {
    L_local._4_4_ = 1;
  }
  else if ((p->ravi_jit).jit_status == '\x01') {
    L_local._4_4_ = 0;
  }
  else if (options == (ravi_compile_options_t *)0x0) {
    L_local._4_4_ = 0;
  }
  else {
    pgVar1 = L->l_G;
    if (pgVar1->ravi_state == (ravi_State *)0x0) {
      L_local._4_4_ = 0;
    }
    else if (pgVar1->ravi_state->jit == (MIR_context_t)0x0) {
      L_local._4_4_ = 0;
    }
    else {
      local_79 = false;
      if (options != (ravi_compile_options_t *)0x0) {
        local_79 = ((ulong)*options & 1) != 0;
      }
      buf.pos._7_1_ = local_79;
      if ((local_79 == false) && ((*(ushort *)&pgVar1->ravi_state->field_0x10 >> 3 & 1) != 0)) {
        if ((p->ravi_jit).jit_flags == '\x01') {
          buf.pos._7_1_ = true;
        }
        else if (pgVar1->ravi_state->min_code_size_ < p->sizecode) {
          buf.pos._7_1_ = true;
        }
        else if ((int)(uint)(p->ravi_jit).execution_count < pgVar1->ravi_state->min_exec_count_) {
          (p->ravi_jit).execution_count = (p->ravi_jit).execution_count + 1;
        }
        else {
          buf.pos._7_1_ = true;
        }
      }
      if ((bool)buf.pos._7_1_ == false) {
        L_local._4_4_ = 0;
      }
      else {
        _Var2 = raviJ_cancompile(p);
        if (_Var2) {
          if (pgVar1->ravi_state->compiling_ == 0) {
            pgVar1->ravi_state->compiling_ = 1;
            membuff_init((membuff_t *)&fp,0x1000);
            stack0xffffffffffffffa8 = (lua_CFunction)0x0;
            pgVar1->ravi_state->id = pgVar1->ravi_state->id + 1;
            snprintf(local_78,0x1e,"jit%lld");
            _Var2 = raviJ_codegen(L,p,options,local_78,(membuff_t *)&fp);
            s = fp;
            if (_Var2) {
              if ((((ulong)*options & 1) != 0) &&
                 ((*(ushort *)&pgVar1->ravi_state->field_0x10 & 7) != 0)) {
                len = strlen((char *)fp);
                ravi_writestring(L,(char *)s,len);
                ravi_writeline(L);
              }
              register0x00000000 =
                   (lua_CFunction)
                   compile_C_module(&pgVar1->ravi_state->options,pgVar1->ravi_state->jit,(char *)fp,
                                    local_78);
              if (register0x00000000 == (lua_CFunction)0x0) {
                (p->ravi_jit).jit_status = '\x01';
              }
              else {
                (p->ravi_jit).jit_data = (void *)0x0;
                (p->ravi_jit).jit_function = register0x00000000;
                (p->ravi_jit).jit_status = '\x02';
              }
            }
            else {
              (p->ravi_jit).jit_status = '\x01';
            }
            membuff_free((membuff_t *)&fp);
            pgVar1->ravi_state->compiling_ = 0;
            L_local._4_4_ = (uint)(stack0xffffffffffffffa8 != (lua_CFunction)0x0);
          }
          else {
            L_local._4_4_ = 0;
          }
        }
        else {
          (p->ravi_jit).jit_status = '\x01';
          L_local._4_4_ = 0;
        }
      }
    }
  }
  return L_local._4_4_;
}

Assistant:

int raviV_compile(struct lua_State *L, struct Proto *p, ravi_compile_options_t *options) {
  if (p->ravi_jit.jit_status == RAVI_JIT_COMPILED)
    return true;
  else if (p->ravi_jit.jit_status == RAVI_JIT_CANT_COMPILE)
    return false;
  if (options == NULL)
    return false;

  global_State *G = G(L);
  if (G->ravi_state == NULL)
    return false;
  if (G->ravi_state->jit == NULL)
    return false;

  bool doCompile = (bool)(options && options->manual_request != 0);
  if (!doCompile && G->ravi_state->auto_) {
    if (p->ravi_jit.jit_flags == RAVI_JIT_FLAG_HASFORLOOP) /* function has fornum loop, so compile */
      doCompile = true;
    else if (p->sizecode > G->ravi_state->min_code_size_) /* function is long so compile */
      doCompile = true;
    else {
      if (p->ravi_jit.execution_count < G->ravi_state->min_exec_count_) /* function has been executed many
                                                                                      times so compile */
        p->ravi_jit.execution_count++;
      else
        doCompile = true;
    }
  }
  if (!doCompile) {
    return false;
  }
  if (!raviJ_cancompile(p)) {
    p->ravi_jit.jit_status = RAVI_JIT_CANT_COMPILE;
    return false;
  }

  if (G->ravi_state->compiling_)
    return false;
  G->ravi_state->compiling_ = 1;

  membuff_t buf;
  membuff_init(&buf, 4096);

  int (*fp)(lua_State * L) = NULL;
  char fname[30];
  snprintf(fname, sizeof fname, "jit%lld", G->ravi_state->id++);
  if (!raviJ_codegen(L, p, options, fname, &buf)) {
    p->ravi_jit.jit_status = RAVI_JIT_CANT_COMPILE;
    goto Lerror;
  }
  if (options->manual_request && G->ravi_state->verbosity_) {
    ravi_writestring(L, buf.buf, strlen(buf.buf));
    ravi_writeline(L);
  }
  fp = compile_C_module(&G->ravi_state->options, G->ravi_state->jit, buf.buf, fname);
  if (!fp) {
    p->ravi_jit.jit_status = RAVI_JIT_CANT_COMPILE;
  }
  else {
    p->ravi_jit.jit_data = NULL;
    p->ravi_jit.jit_function = fp;
    p->ravi_jit.jit_status = RAVI_JIT_COMPILED;
  }
Lerror:
  membuff_free(&buf);
  G->ravi_state->compiling_ = 0;
  return fp != NULL;
}